

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

string * __thiscall
absl::lts_20250127::ReportError_abi_cxx11_
          (string *__return_storage_ptr__,lts_20250127 *this,Nonnull<CordRep_*> root,
          Nonnull<CordRep_*> node)

{
  ostream *poVar1;
  ostringstream local_198 [8];
  ostringstream buf;
  Nonnull<CordRep_*> node_local;
  Nonnull<CordRep_*> root_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"Error at node ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,root);
  std::operator<<(poVar1," in:");
  DumpNode((Nonnull<CordRep_*>)this,true,(Nonnull<std::ostream_*>)local_198,0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

static std::string ReportError(absl::Nonnull<CordRep*> root,
                               absl::Nonnull<CordRep*> node) {
  std::ostringstream buf;
  buf << "Error at node " << node << " in:";
  DumpNode(root, true, &buf);
  return buf.str();
}